

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.hpp
# Opt level: O3

double __thiscall Instance::objval(Instance *this,QpVector *x)

{
  int iVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double local_60;
  QpVector local_50;
  
  lVar2 = (long)(this->c).num_nz;
  if (lVar2 < 1) {
    dVar5 = 0.0;
  }
  else {
    dVar5 = 0.0;
    lVar3 = 0;
    do {
      iVar1 = (this->c).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3];
      dVar5 = dVar5 + (this->c).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar1] *
                      (x->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar1];
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  MatrixBase::vec_mat(&local_50,&(this->Q).mat,x);
  if ((long)local_50.num_nz < 1) {
    local_60 = this->offset;
    dVar4 = 0.0;
    if (local_50.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_003375e6;
  }
  else {
    dVar4 = 0.0;
    lVar2 = 0;
    do {
      dVar4 = dVar4 + local_50.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [local_50.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar2]] *
                      (x->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [local_50.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar2]];
      lVar2 = lVar2 + 1;
    } while (local_50.num_nz != lVar2);
    local_60 = this->offset;
  }
  operator_delete(local_50.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_003375e6:
  if (local_50.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return dVar4 * 0.5 + dVar5 + local_60;
}

Assistant:

double objval(const QpVector& x) {
    return c * x + 0.5 * (Q.vec_mat(x) * x) + offset;
  }